

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string_t __thiscall
duckdb::UhugeintToStringCast::Format(UhugeintToStringCast *this,uhugeint_t value,Vector *vector)

{
  idx_t len;
  char *__dest;
  string_t result;
  string str;
  anon_union_16_2_67f50693_for_value local_50;
  string local_40;
  uhugeint_t local_20;
  
  local_20.upper = value.lower;
  local_20.lower = (uint64_t)this;
  uhugeint_t::ToString_abi_cxx11_(&local_40,&local_20);
  local_50.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString
                 ((StringVector *)value.upper,(Vector *)local_40._M_string_length,len);
  __dest = local_50._8_8_;
  if (local_50._0_4_ < 0xd) {
    __dest = local_50.pointer.prefix;
  }
  switchD_01939fa4::default(__dest,local_40._M_dataplus._M_p,local_40._M_string_length);
  string_t::Finalize((string_t *)&local_50.pointer);
  ::std::__cxx11::string::~string((string *)&local_40);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50.pointer;
}

Assistant:

static string_t Format(uhugeint_t value, Vector &vector) {
		std::string str = value.ToString();
		string_t result = StringVector::EmptyString(vector, str.length());
		auto data = result.GetDataWriteable();

		memcpy(data, str.data(), str.length()); // NOLINT: null-termination not required
		result.Finalize();
		return result;
	}